

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

ARTConflictType __thiscall
duckdb::ART::Insert(ART *this,Node *node,ARTKey *key,idx_t depth,ARTKey *row_id,GateStatus status,
                   optional_ptr<duckdb::ART,_true> delete_art,IndexAppendMode append_mode)

{
  ulong uVar1;
  ARTConflictType AVar2;
  int iVar3;
  InternalException *this_00;
  allocator local_61;
  ARTKey *local_60;
  optional_ptr<duckdb::ART,_true> local_58;
  string local_50;
  
  local_58.ptr = delete_art.ptr;
  local_60 = row_id;
  do {
    while( true ) {
      uVar1 = (node->super_IndexPointer).data;
      if (uVar1 >> 0x38 == 0) {
        InsertIntoEmpty(this,node,key,depth,local_60,status);
        return NO_CONFLICT;
      }
      if ((long)uVar1 < 0 && status == GATE_NOT_SET) break;
      switch((byte)(uVar1 >> 0x38) & 0x7f) {
      case 1:
        AVar2 = Prefix::Insert(this,node,key,depth,local_60,status,delete_art,append_mode);
        return AVar2;
      case 2:
        Leaf::TransformToNested(this,node);
        break;
      case 3:
      case 4:
      case 5:
      case 6:
        AVar2 = InsertIntoNode(this,node,key,depth,local_60,status,local_58,append_mode);
        return AVar2;
      case 7:
        AVar2 = InsertIntoInlined(this,node,key,depth,local_60,status,local_58,append_mode);
        return AVar2;
      case 8:
      case 9:
      case 10:
        Node::InsertChild(this,node,key->data[7],(Node)0x0);
        return NO_CONFLICT;
      default:
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Invalid node type for ART::Insert.",&local_61);
        InternalException::InternalException(this_00,&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    iVar3 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])(this);
    status = GATE_SET;
    depth = 0;
    key = local_60;
  } while (1 < (byte)((char)iVar3 - 1U));
  return TRANSACTION;
}

Assistant:

ARTConflictType ART::Insert(Node &node, const ARTKey &key, idx_t depth, const ARTKey &row_id, const GateStatus status,
                            optional_ptr<ART> delete_art, const IndexAppendMode append_mode) {
	if (!node.HasMetadata()) {
		InsertIntoEmpty(node, key, depth, row_id, status);
		return ARTConflictType::NO_CONFLICT;
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && node.GetGateStatus() == GateStatus::GATE_SET) {
		if (IsUnique()) {
			// Unique indexes can have duplicates, if another transaction DELETE + INSERT
			// the same key. In that case, the previous value must be kept alive until all
			// other transactions do not depend on it anymore.

			// We restrict this transactionality to two-value leaves, so any subsequent
			// incoming transaction must fail here.
			return ARTConflictType::TRANSACTION;
		}
		return Insert(node, row_id, 0, row_id, GateStatus::GATE_SET, delete_art, append_mode);
	}

	auto type = node.GetType();
	switch (type) {
	case NType::LEAF_INLINED: {
		return InsertIntoInlined(node, key, depth, row_id, status, delete_art, append_mode);
	}
	case NType::LEAF: {
		Leaf::TransformToNested(*this, node);
		return Insert(node, key, depth, row_id, status, delete_art, append_mode);
	}
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF: {
		// Row IDs are unique, so there are never any duplicate byte conflicts here.
		auto byte = key[Prefix::ROW_ID_COUNT];
		Node::InsertChild(*this, node, byte);
		return ARTConflictType::NO_CONFLICT;
	}
	case NType::NODE_4:
	case NType::NODE_16:
	case NType::NODE_48:
	case NType::NODE_256:
		return InsertIntoNode(node, key, depth, row_id, status, delete_art, append_mode);
	case NType::PREFIX:
		return Prefix::Insert(*this, node, key, depth, row_id, status, delete_art, append_mode);
	default:
		throw InternalException("Invalid node type for ART::Insert.");
	}
}